

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextboundaryfinder.cpp
# Opt level: O2

qsizetype __thiscall QTextBoundaryFinder::toNextBoundary(QTextBoundaryFinder *this)

{
  QCharAttributes *pQVar1;
  long lVar2;
  long lVar3;
  qsizetype qVar4;
  
  pQVar1 = this->attributes;
  if (((pQVar1 == (QCharAttributes *)0x0) || (lVar2 = this->pos, lVar2 < 0)) ||
     (lVar3 = (this->sv).m_size, lVar3 <= lVar2)) {
    this->pos = -1;
    qVar4 = -1;
  }
  else {
    qVar4 = lVar2 + 1;
    this->pos = qVar4;
    switch(this->t) {
    case Grapheme:
      while ((qVar4 < lVar3 && (((byte)pQVar1[qVar4] & 1) == 0))) {
        qVar4 = qVar4 + 1;
        this->pos = qVar4;
      }
      break;
    case Word:
      while ((qVar4 < lVar3 && (((byte)pQVar1[qVar4] & 2) == 0))) {
        qVar4 = qVar4 + 1;
        this->pos = qVar4;
      }
      break;
    case Sentence:
      while ((qVar4 < lVar3 && (((byte)pQVar1[qVar4] & 4) == 0))) {
        qVar4 = qVar4 + 1;
        this->pos = qVar4;
      }
      break;
    case Line:
      while ((qVar4 < lVar3 && (((byte)pQVar1[qVar4] & 8) == 0))) {
        qVar4 = qVar4 + 1;
        this->pos = qVar4;
      }
    }
  }
  return qVar4;
}

Assistant:

qsizetype QTextBoundaryFinder::toNextBoundary()
{
    if (!attributes || pos < 0 || pos >= sv.size()) {
        pos = -1;
        return pos;
    }

    ++pos;
    switch(t) {
    case Grapheme:
        while (pos < sv.size() && !attributes[pos].graphemeBoundary)
            ++pos;
        break;
    case Word:
        while (pos < sv.size() && !attributes[pos].wordBreak)
            ++pos;
        break;
    case Sentence:
        while (pos < sv.size() && !attributes[pos].sentenceBoundary)
            ++pos;
        break;
    case Line:
        while (pos < sv.size() && !attributes[pos].lineBreak)
            ++pos;
        break;
    }

    return pos;
}